

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedAEAD(EVP_AEAD *aead,string *name,size_t ad_len,string *selected)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  reference puVar4;
  string local_70;
  size_t local_50;
  size_t chunk_len;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  string *selected_local;
  size_t ad_len_local;
  string *name_local;
  EVP_AEAD *aead_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (lVar3 = std::__cxx11::string::find((string *)name,(ulong)selected), lVar3 == -1)) {
    return true;
  }
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&g_chunk_lengths);
  chunk_len = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                (&g_chunk_lengths);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&chunk_len);
    if (!bVar1) {
      return true;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    local_50 = *puVar4;
    std::__cxx11::string::string((string *)&local_70,(string *)name);
    bVar1 = SpeedAEADChunk(aead,&local_70,local_50,ad_len,evp_aead_seal);
    std::__cxx11::string::~string((string *)&local_70);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

static bool SpeedAEAD(const EVP_AEAD *aead, const std::string &name,
                      size_t ad_len, const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  for (size_t chunk_len : g_chunk_lengths) {
    if (!SpeedAEADChunk(aead, name, chunk_len, ad_len, evp_aead_seal)) {
      return false;
    }
  }
  return true;
}